

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O0

int Abc_SclCountMaxPhases(Abc_Ntk_t *pNtk)

{
  int iVar1;
  uint i_00;
  int iVar2;
  Vec_Int_t *p;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pObj_01;
  int local_38;
  int local_34;
  int MaxAll;
  int Max;
  int k;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Vec_Int_t *vPhLevel;
  Abc_Ntk_t *pNtk_local;
  
  local_38 = 0;
  iVar1 = Abc_NtkObjNumMax(pNtk);
  p = Vec_IntStart(iVar1);
  for (Max = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), Max < iVar1; Max = Max + 1) {
    pObj_00 = Abc_NtkObj(pNtk,Max);
    if ((pObj_00 != (Abc_Obj_t *)0x0) &&
       ((iVar1 = Abc_ObjIsNode(pObj_00), iVar1 != 0 || (iVar1 = Abc_ObjIsCo(pObj_00), iVar1 != 0))))
    {
      local_34 = 0;
      for (MaxAll = 0; iVar1 = Abc_ObjFaninNum(pObj_00), MaxAll < iVar1; MaxAll = MaxAll + 1) {
        pObj_01 = Abc_ObjFanin(pObj_00,MaxAll);
        i_00 = Abc_ObjId(pObj_01);
        iVar1 = Vec_IntEntry(p,i_00);
        iVar2 = Abc_ObjFaninPhase(pObj_00,MaxAll);
        local_34 = Abc_MaxInt(local_34,iVar1 + iVar2);
      }
      Vec_IntWriteEntry(p,Max,local_34);
      local_38 = Abc_MaxInt(local_38,local_34);
    }
  }
  Vec_IntFree(p);
  return local_38;
}

Assistant:

int Abc_SclCountMaxPhases( Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vPhLevel;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, Max = 0, MaxAll = 0;
    vPhLevel = Vec_IntStart( Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachNodeCo( pNtk, pObj, i )
    {
        Max = 0;
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Max = Abc_MaxInt( Max, Vec_IntEntry(vPhLevel, Abc_ObjId(pFanin)) + Abc_ObjFaninPhase(pObj, k) );
        Vec_IntWriteEntry( vPhLevel, i, Max );
        MaxAll = Abc_MaxInt( MaxAll, Max );
    }
    Vec_IntFree( vPhLevel );
    return MaxAll;
}